

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall
QItemSelectionModel::emitSelectionChanged
          (QItemSelectionModel *this,QItemSelection *newSelection,QItemSelection *oldSelection)

{
  bool bVar1;
  compare_eq_result_container<QList<QItemSelectionRange>,_QItemSelectionRange> cVar2;
  bool bVar3;
  qsizetype qVar4;
  QItemSelection *in_RDI;
  long in_FS_OFFSET;
  int s_2;
  int o_2;
  int i;
  int s_1;
  int o_1;
  int s;
  int o;
  bool advance;
  QItemSelection intersections;
  QItemSelection selected;
  QItemSelection deselected;
  QItemSelectionRange *in_stack_fffffffffffffe98;
  QItemSelectionRange *in_stack_fffffffffffffea0;
  const_reference in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  QList<QItemSelectionRange> *in_stack_fffffffffffffed0;
  QItemSelectionRange *in_stack_fffffffffffffed8;
  QItemSelectionRange *in_stack_fffffffffffffee0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_84;
  int local_80;
  QItemSelectionRange *in_stack_ffffffffffffffa0;
  QItemSelectionRange *in_stack_ffffffffffffffa8;
  QList<QItemSelectionRange> local_50;
  QList<QItemSelectionRange> local_38;
  QList<QItemSelectionRange> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x82c3d1);
  if (((!bVar1) ||
      (bVar1 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x82c3e4), !bVar1))
     && (cVar2 = QList<QItemSelectionRange>::operator==
                           ((QList<QItemSelectionRange> *)in_stack_fffffffffffffed8,
                            in_stack_fffffffffffffed0), !cVar2)) {
    bVar1 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x82c415);
    if ((bVar1) ||
       (bVar1 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x82c426), bVar1))
    {
      selectionChanged((QItemSelectionModel *)in_stack_fffffffffffffea0,
                       (QItemSelection *)in_stack_fffffffffffffe98,(QItemSelection *)0x82c449);
    }
    else {
      local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_20.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QItemSelection::QItemSelection
                ((QItemSelection *)in_stack_fffffffffffffea0,
                 (QItemSelection *)in_stack_fffffffffffffe98);
      local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QItemSelection::QItemSelection
                ((QItemSelection *)in_stack_fffffffffffffea0,
                 (QItemSelection *)in_stack_fffffffffffffe98);
      for (local_80 = 0; qVar4 = QList<QItemSelectionRange>::size(&local_20), local_80 < qVar4;
          local_80 = local_80 + 1) {
        bVar1 = true;
        local_84 = 0;
        while( true ) {
          qVar4 = QList<QItemSelectionRange>::size(&local_38);
          bVar3 = false;
          if (local_84 < qVar4) {
            qVar4 = QList<QItemSelectionRange>::size(&local_20);
            bVar3 = local_80 < qVar4;
          }
          if (!bVar3) break;
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                     (qsizetype)in_stack_fffffffffffffe98);
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                     (qsizetype)in_stack_fffffffffffffe98);
          bVar3 = ::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          if (bVar3) {
            QList<QItemSelectionRange>::removeAt
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
            QList<QItemSelectionRange>::removeAt
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
            bVar1 = false;
          }
          else {
            local_84 = local_84 + 1;
          }
        }
        if (bVar1) {
          local_80 = local_80 + 1;
        }
      }
      local_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_50.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
      local_50.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QItemSelection::QItemSelection((QItemSelection *)0x82c6c4);
      for (local_98 = 0; qVar4 = QList<QItemSelectionRange>::size(&local_20), local_98 < qVar4;
          local_98 = local_98 + 1) {
        for (local_9c = 0; qVar4 = QList<QItemSelectionRange>::size(&local_38), local_9c < qVar4;
            local_9c = local_9c + 1) {
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                     (qsizetype)in_stack_fffffffffffffe98);
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                     (qsizetype)in_stack_fffffffffffffe98);
          bVar1 = QItemSelectionRange::intersects
                            ((QItemSelectionRange *)
                             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                             in_stack_fffffffffffffeb8);
          if (bVar1) {
            QList<QItemSelectionRange>::at
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
            QList<QItemSelectionRange>::at
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
            QItemSelectionRange::intersected(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            QList<QItemSelectionRange>::append
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       in_stack_fffffffffffffe98);
            QItemSelectionRange::~QItemSelectionRange(in_stack_fffffffffffffea0);
          }
        }
      }
      for (local_a0 = 0; qVar4 = QList<QItemSelectionRange>::size(&local_50), local_a0 < qVar4;
          local_a0 = local_a0 + 1) {
        local_a4 = 0;
        while (qVar4 = QList<QItemSelectionRange>::size(&local_20), local_a4 < qVar4) {
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                     (qsizetype)in_stack_fffffffffffffe98);
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                     (qsizetype)in_stack_fffffffffffffe98);
          bVar1 = QItemSelectionRange::intersects
                            ((QItemSelectionRange *)
                             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                             in_stack_fffffffffffffeb8);
          if (bVar1) {
            QList<QItemSelectionRange>::at
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
            QList<QItemSelectionRange>::at
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
            QItemSelection::split(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RDI);
            QList<QItemSelectionRange>::removeAt
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
          }
          else {
            local_a4 = local_a4 + 1;
          }
        }
        local_a8 = 0;
        while (qVar4 = QList<QItemSelectionRange>::size(&local_38), local_a8 < qVar4) {
          in_stack_fffffffffffffeb8 =
               QList<QItemSelectionRange>::at
                         ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                          (qsizetype)in_stack_fffffffffffffe98);
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                     (qsizetype)in_stack_fffffffffffffe98);
          in_stack_fffffffffffffec7 =
               QItemSelectionRange::intersects
                         ((QItemSelectionRange *)
                          CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                          in_stack_fffffffffffffeb8);
          if ((bool)in_stack_fffffffffffffec7) {
            QList<QItemSelectionRange>::at
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
            QList<QItemSelectionRange>::at
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
            QItemSelection::split(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_RDI);
            QList<QItemSelectionRange>::removeAt
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
          }
          else {
            local_a8 = local_a8 + 1;
          }
        }
      }
      bVar1 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x82cabb);
      if ((!bVar1) ||
         (bVar1 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x82cace),
         !bVar1)) {
        selectionChanged((QItemSelectionModel *)in_stack_fffffffffffffea0,
                         (QItemSelection *)in_stack_fffffffffffffe98,(QItemSelection *)0x82caef);
      }
      QItemSelection::~QItemSelection((QItemSelection *)0x82cb00);
      QItemSelection::~QItemSelection((QItemSelection *)0x82cb0d);
      QItemSelection::~QItemSelection((QItemSelection *)0x82cb1a);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelectionModel::emitSelectionChanged(const QItemSelection &newSelection,
                                               const QItemSelection &oldSelection)
{
    // if both selections are empty or equal we return
    if ((oldSelection.isEmpty() && newSelection.isEmpty()) ||
        oldSelection == newSelection)
        return;

    // if either selection is empty we do not need to compare
    if (oldSelection.isEmpty() || newSelection.isEmpty()) {
        emit selectionChanged(newSelection, oldSelection);
        return;
    }

    QItemSelection deselected = oldSelection;
    QItemSelection selected = newSelection;

    // remove equal ranges
    bool advance;
    for (int o = 0; o < deselected.size(); ++o) {
        advance = true;
        for (int s = 0; s < selected.size() && o < deselected.size();) {
            if (deselected.at(o) == selected.at(s)) {
                deselected.removeAt(o);
                selected.removeAt(s);
                advance = false;
            } else {
                ++s;
            }
        }
        if (advance)
            ++o;
    }

    // find intersections
    QItemSelection intersections;
    for (int o = 0; o < deselected.size(); ++o) {
        for (int s = 0; s < selected.size(); ++s) {
            if (deselected.at(o).intersects(selected.at(s)))
                intersections.append(deselected.at(o).intersected(selected.at(s)));
        }
    }

    // compare remaining ranges with intersections and split them to find deselected and selected
    for (int i = 0; i < intersections.size(); ++i) {
        // split deselected
        for (int o = 0; o < deselected.size();) {
            if (deselected.at(o).intersects(intersections.at(i))) {
                QItemSelection::split(deselected.at(o), intersections.at(i), &deselected);
                deselected.removeAt(o);
            } else {
                ++o;
            }
        }
        // split selected
        for (int s = 0; s < selected.size();) {
            if (selected.at(s).intersects(intersections.at(i))) {
                QItemSelection::split(selected.at(s), intersections.at(i), &selected);
                selected.removeAt(s);
            } else {
                ++s;
            }
        }
    }

    if (!selected.isEmpty() || !deselected.isEmpty())
        emit selectionChanged(selected, deselected);
}